

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall cmCTestRunTest::StartAgain(cmCTestRunTest *this,size_t completed)

{
  bool bVar1;
  int __errnum;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_48 [8];
  cmWorkingDirectory workdir;
  size_t completed_local;
  cmCTestRunTest *this_local;
  
  if ((this->RunAgain & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    this->RunAgain = false;
    workdir._32_8_ = completed;
    cmWorkingDirectory::cmWorkingDirectory
              ((cmWorkingDirectory *)local_48,&this->TestProperties->Directory);
    bVar1 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_48);
    if (bVar1) {
      std::operator+(&local_b8,"Failed to change working directory to ",
                     &this->TestProperties->Directory);
      std::operator+(&local_98,&local_b8," : ");
      __errnum = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_48);
      __rhs = strerror(__errnum);
      std::operator+(&local_78,&local_98,__rhs);
      StartFailure(this,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      StartTest(this,workdir._32_8_,this->TotalNumberOfTests);
    }
    this_local._7_1_ = true;
    cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestRunTest::StartAgain(size_t completed)
{
  if (!this->RunAgain) {
    return false;
  }
  this->RunAgain = false; // reset
  // change to tests directory
  cmWorkingDirectory workdir(this->TestProperties->Directory);
  if (workdir.Failed()) {
    this->StartFailure("Failed to change working directory to " +
                       this->TestProperties->Directory + " : " +
                       std::strerror(workdir.GetLastResult()));
    return true;
  }

  this->StartTest(completed, this->TotalNumberOfTests);
  return true;
}